

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

Result emulator_write_ext_ram(Emulator *e,FileData *file_data)

{
  Result RVar1;
  
  RVar1 = OK;
  if ((e->state).ext_ram.battery_type == BATTERY_TYPE_WITH_BATTERY) {
    RVar1 = ERROR;
    if ((e->state).ext_ram.size <= file_data->size) {
      memcpy(file_data->data,&(e->state).ext_ram,file_data->size);
      RVar1 = OK;
    }
  }
  return RVar1;
}

Assistant:

Result emulator_write_ext_ram(Emulator* e, FileData* file_data) {
  if (EXT_RAM.battery_type != BATTERY_TYPE_WITH_BATTERY)
    return OK;

  CHECK(file_data->size >= EXT_RAM.size);
  memcpy(file_data->data, EXT_RAM.data, file_data->size);
  return OK;
  ON_ERROR_RETURN;
}